

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

char paranoid_yn(char *query,boolean paranoid)

{
  int iVar1;
  char local_328 [8];
  char query_yesno [512];
  char buf [256];
  boolean paranoid_local;
  char *query_local;
  
  if (paranoid == '\0') {
    query_local._7_1_ = yn_function(query,"yn",'n');
  }
  else {
    sprintf(local_328,"%s [yes/no]",query);
    getlin(local_328,query_yesno + 0x1f8);
    lcase(query_yesno + 0x1f8);
    iVar1 = strcmp(query_yesno + 0x1f8,"yes");
    query_local._7_1_ = 'n';
    if (iVar1 == 0) {
      query_local._7_1_ = 'y';
    }
  }
  return query_local._7_1_;
}

Assistant:

char paranoid_yn(const char *query, boolean paranoid)
{
	if (paranoid) {
	    char buf[BUFSZ];
	    char query_yesno[2 * BUFSZ];
	    /* put [yes/no] between question and question mark? */
	    sprintf(query_yesno, "%s [yes/no]", query);
	    getlin(query_yesno, buf);
	    lcase(buf);
	    return !(strcmp (buf, "yes")) ? 'y' : 'n';
	} else
	    return yn(query);
}